

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O1

char * __thiscall masksearch::search(masksearch *this,char *first,char *last,CallbackType *cb)

{
  pointer ppVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  char cVar5;
  pointer ppVar6;
  char *p;
  char *pcVar7;
  char *pcVar8;
  char *local_40;
  char *local_38;
  
  ppVar6 = (this->patterns).
           super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->patterns).
           super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar6 == ppVar1) {
      return last;
    }
    puVar2 = (ppVar6->first).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar3 = (ppVar6->first).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pcVar7 = first;
    do {
      if (pcVar7 == last) goto LAB_00126e94;
      pcVar8 = pcVar7 + ((long)(ppVar6->first).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start -
                        (long)(ppVar6->first).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish);
      if (pcVar8 == last) {
        cVar5 = '\x05';
      }
      else {
        local_40 = pcVar8 + ((long)puVar2 - (long)puVar3);
        local_38 = pcVar8;
        if ((cb->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        bVar4 = (*cb->_M_invoker)((_Any_data *)cb,&local_38,&local_40);
        cVar5 = !bVar4;
        if (bVar4) {
          pcVar7 = pcVar8 + 1;
        }
      }
    } while (cVar5 == '\0');
    if (cVar5 != '\x05') {
      return (char *)0x0;
    }
LAB_00126e94:
    ppVar6 = ppVar6 + 1;
  } while( true );
}

Assistant:

const char *search(const char *first, const char *last, CallbackType cb)
    {
        for (auto& bm : patterns)
        {
            auto size = bm.first.size();

            auto p = first;
            while (p != last) {
                auto f = maskedsearch(p, last, bm);
                if (f == last)
                    break;
                if (!cb((const char*)f, (const char*)f + size))
                    return NULL;
                p = f + 1;
            }
        }
        return last;
    }